

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Read<int>(KDataStream *this,int *T)

{
  reference pvVar1;
  byte local_1d;
  int local_1c;
  KUINT8 i;
  int *piStack_18;
  NetToDataType<int> OctArray;
  int *T_local;
  KDataStream *this_local;
  
  piStack_18 = T;
  T_local = (int *)this;
  NetToDataType<int>::NetToDataType((NetToDataType<int> *)&local_1c,*T,false);
  local_1d = 0;
  while (local_1d < 4) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_vBuffer,(ulong)this->m_ui16CurrentWritePos);
    *(value_type *)((long)&local_1c + (ulong)local_1d) = *pvVar1;
    local_1d = local_1d + 1;
    this->m_ui16CurrentWritePos = this->m_ui16CurrentWritePos + 1;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<int>::SwapBytes((NetToDataType<int> *)&local_1c);
  }
  *piStack_18 = local_1c;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}